

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarrisCorner.cpp
# Opt level: O1

void localMaxima(Mat *cNorm,vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_> *corners,
                int threshold)

{
  int iVar1;
  uint uVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  long lVar11;
  int m;
  float *pfVar12;
  ulong uVar13;
  long lVar14;
  float *pfVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  float fVar20;
  float fVar21;
  Mat cThreshold;
  KeyPoint kPoint;
  long local_220;
  Mat local_1f8 [8];
  int local_1f0;
  int local_1ec;
  long local_1e8;
  long *local_1b0;
  ulong local_198;
  undefined1 local_190 [16];
  float local_180;
  undefined8 local_17c;
  Mat local_120 [96];
  Mat local_c0 [144];
  
  local_198 = **(ulong **)(cNorm + 0x40) << 0x20 | **(ulong **)(cNorm + 0x40) >> 0x20;
  cv::Mat::zeros(local_190,&local_198,5);
  cv::Mat::Mat(local_1f8);
  (**(code **)(*(long *)CONCAT44(local_190._4_4_,local_190._0_4_) + 0x18))
            ((long *)CONCAT44(local_190._4_4_,local_190._0_4_),local_190,local_1f8,0xffffffff);
  cv::Mat::~Mat(local_c0);
  cv::Mat::~Mat(local_120);
  cv::Mat::~Mat((Mat *)&local_180);
  iVar1 = *(int *)(cNorm + 8);
  lVar7 = (long)iVar1;
  uVar2 = *(uint *)(cNorm + 0xc);
  if (0 < lVar7) {
    lVar11 = *(long *)(cNorm + 0x10);
    plVar3 = *(long **)(cNorm + 0x48);
    lVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        lVar14 = *plVar3;
        uVar13 = 0;
        do {
          fVar20 = *(float *)(lVar14 * lVar8 + lVar11 + uVar13 * 4);
          if ((float)threshold <= fVar20) {
            *(float *)(*local_1b0 * lVar8 + local_1e8 + uVar13 * 4) = fVar20;
          }
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar7);
  }
  if (3 < local_1f0) {
    uVar13 = 1;
    local_220 = 0;
    do {
      if (3 < local_1ec) {
        lVar11 = *local_1b0;
        pfVar10 = (float *)(lVar11 * local_220 + local_1e8);
        uVar18 = 1;
        iVar17 = 0;
        do {
          fVar20 = 0.0;
          iVar6 = -1;
          lVar8 = -1;
          iVar5 = -1;
          pfVar12 = pfVar10;
          do {
            iVar19 = (int)uVar13 + (int)lVar8;
            lVar14 = 0;
            pfVar15 = pfVar12;
            fVar21 = fVar20;
            do {
              fVar20 = *pfVar15;
              pfVar9 = pfVar15;
              if (((fVar20 == 0.0) && (!NAN(fVar20))) || (fVar20 < fVar21)) {
LAB_001067fb:
                fVar20 = fVar21;
                *pfVar9 = 0.0;
                iVar4 = iVar5;
                iVar16 = iVar6;
              }
              else {
                iVar16 = (int)lVar14 + iVar17;
                iVar4 = iVar19;
                if (iVar5 != -1) {
                  pfVar9 = (float *)(iVar5 * lVar11 + local_1e8 + (long)iVar6 * 4);
                  fVar21 = fVar20;
                  iVar5 = iVar19;
                  iVar6 = iVar16;
                  goto LAB_001067fb;
                }
              }
              iVar6 = iVar16;
              iVar5 = iVar4;
              pfVar15 = pfVar15 + 1;
              lVar14 = lVar14 + 1;
              fVar21 = fVar20;
            } while (lVar14 != 3);
            lVar8 = lVar8 + 1;
            pfVar12 = (float *)((long)pfVar12 + lVar11);
          } while (lVar8 != 2);
          uVar18 = uVar18 + 1;
          pfVar10 = pfVar10 + 1;
          iVar17 = iVar17 + 1;
        } while (uVar18 != local_1ec - 2);
      }
      uVar13 = uVar13 + 1;
      local_220 = local_220 + 1;
    } while (uVar13 != local_1f0 - 2);
  }
  if (0 < iVar1) {
    lVar11 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar13 = 0;
        do {
          fVar20 = *(float *)(*local_1b0 * lVar11 + local_1e8 + uVar13 * 4);
          if ((fVar20 != 0.0) || (NAN(fVar20))) {
            local_190._0_4_ = (undefined4)(int)uVar13;
            local_190._8_4_ = 5.0;
            local_190._12_4_ = -1.0;
            local_17c._0_4_ = 0;
            local_17c._4_4_ = -1;
            local_190._4_4_ = (float)(int)lVar11;
            local_180 = fVar20;
            std::vector<cv::KeyPoint,_std::allocator<cv::KeyPoint>_>::push_back
                      (corners,(value_type *)local_190);
          }
          uVar13 = uVar13 + 1;
        } while (uVar2 != uVar13);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar7);
  }
  cv::Mat::~Mat(local_1f8);
  return;
}

Assistant:

void localMaxima(const cv::Mat& cNorm, std::vector<KeyPoint>& corners, int threshold) {

	Mat cThreshold = Mat::zeros(cNorm.size(), CV_32F);

	int rows = cNorm.rows;
	int cols = cNorm.cols;
	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cNorm.at<float>(i, j);
			if (intensity >= threshold) {
				cThreshold.at<float>(i, j) = intensity;
			}
		}
	}

	for (int i = 1; i < cThreshold.rows - 2; ++i) {
		for (int j = 1; j < cThreshold.cols - 2; ++j) {
			//loop within 3*3 box
			float max = 0;
			int row=-1, col=-1;
			for (int m = -1; m < 2; ++m) {
				for (int n = -1; n < 2; ++n) {
					float current = cThreshold.at<float>(i+m, j+n);
					if (current!=0 && current >= max) {
						max = current;
						//set previous max to 0
						if (row != -1) cThreshold.at<float>(row, col) = 0.0F;
						row = i + m;
						col = j + n;
					}
					else {
						cThreshold.at<float>(i+m,j+n) = 0.0F;
					}
				}
			}

		}
	}

	for (int i = 0; i < rows; ++i) {
		for (int j = 0; j < cols; ++j) {
			float intensity = cThreshold.at<float>(i, j);
			if (intensity != 0) {
				KeyPoint kPoint(Point(j, i), 5, -1.0F, intensity);
				corners.push_back(kPoint);
			}
		}
	}

}